

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall libtorrent::torrent_info::~torrent_info(torrent_info *this)

{
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&this->m_info_dict);
  ::std::__cxx11::string::~string((string *)&this->m_created_by);
  ::std::__cxx11::string::~string((string *)&this->m_comment);
  boost::detail::shared_count::~shared_count(&(this->m_info_section).pn);
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&(this->m_piece_layers).
             super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           );
  ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  ~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 *)&this->m_merkle_tree);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_owned_collections);
  ::std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&(this->m_collections).
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  ~_Vector_base(&(this->m_owned_similar_torrents).
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               );
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&this->m_nodes);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::~vector
            (&this->m_web_seeds);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::~vector(&(this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           );
  ::std::
  unique_ptr<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>::
  ~unique_ptr(&(this->m_orig_files).m_ptr);
  file_storage::~file_storage(&this->m_files);
  return;
}

Assistant:

torrent_info::~torrent_info() = default;